

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

reentrant_put_transaction<int> * __thiscall
density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
start_reentrant_push<int>
          (reentrant_put_transaction<int> *__return_storage_ptr__,
          heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *this,int *i_source)

{
  reentrant_put_transaction<int> local_50;
  reentrant_put_transaction<int> local_38;
  
  local_38.m_put_data =
       heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
       inplace_allocate<1ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
                   *)this);
  local_38.m_put_data.m_control_block[1].m_next =
       (uintptr_t)
       detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(int *)local_38.m_put_data.m_user_storage = *i_source;
  local_38.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  local_50.m_put_data = local_38.m_put_data;
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_38);
  __return_storage_ptr__->m_queue = this;
  __return_storage_ptr__->m_put_data = local_50.m_put_data;
  local_50.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_50);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<typename std::decay<ELEMENT_TYPE>::type>
          start_reentrant_push(ELEMENT_TYPE && i_source)
        {
            return start_reentrant_emplace<typename std::decay<ELEMENT_TYPE>::type>(
              std::forward<ELEMENT_TYPE>(i_source));
        }